

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

S2Cap * __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound
          (S2Cap *__return_storage_ptr__,S2ShapeIndexRegion<S2ShapeIndex> *this)

{
  vector<S2CellId,_std::allocator<S2CellId>_> local_78;
  S2CellUnion local_60;
  undefined1 local_30 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> covering;
  S2ShapeIndexRegion<S2ShapeIndex> *this_local;
  
  covering.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  GetCellUnionBound(this,(vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            (&local_78,(vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  S2CellUnion::S2CellUnion(&local_60,&local_78);
  S2CellUnion::GetCapBound(__return_storage_ptr__,&local_60);
  S2CellUnion::~S2CellUnion(&local_60);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector(&local_78);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2ShapeIndexRegion<IndexType>::GetCapBound() const {
  std::vector<S2CellId> covering;
  GetCellUnionBound(&covering);
  return S2CellUnion(std::move(covering)).GetCapBound();
}